

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O3

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,std::__cxx11::string>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::DiagCode,void>,std::equal_to<slang::DiagCode>,std::allocator<std::pair<slang::DiagCode_const,std::__cxx11::string>>>
::nosize_unchecked_emplace_at<std::pair<slang::DiagCode&&,std::__cxx11::string&&>>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,std::__cxx11::string>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::DiagCode,void>,std::equal_to<slang::DiagCode>,std::allocator<std::pair<slang::DiagCode_const,std::__cxx11::string>>>
          *this,arrays_type *arrays_,size_t pos0,size_t hash,
          pair<slang::DiagCode_&&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&>
          *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  group_type_pointer pgVar2;
  value_type_pointer ppVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  group_type_pointer pgVar5;
  value_type_pointer ppVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  pointer pcVar8;
  ulong uVar9;
  uint uVar10;
  ushort uVar11;
  size_type sVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  pgVar5 = arrays_->groups_;
  lVar13 = pos0 * 0x10;
  pgVar2 = pgVar5 + pos0;
  auVar16[0] = -(pgVar2->m[0].n == '\0');
  auVar16[1] = -(pgVar2->m[1].n == '\0');
  auVar16[2] = -(pgVar2->m[2].n == '\0');
  auVar16[3] = -(pgVar2->m[3].n == '\0');
  auVar16[4] = -(pgVar2->m[4].n == '\0');
  auVar16[5] = -(pgVar2->m[5].n == '\0');
  auVar16[6] = -(pgVar2->m[6].n == '\0');
  auVar16[7] = -(pgVar2->m[7].n == '\0');
  auVar16[8] = -(pgVar2->m[8].n == '\0');
  auVar16[9] = -(pgVar2->m[9].n == '\0');
  auVar16[10] = -(pgVar2->m[10].n == '\0');
  auVar16[0xb] = -(pgVar2->m[0xb].n == '\0');
  auVar16[0xc] = -(pgVar2->m[0xc].n == '\0');
  auVar16[0xd] = -(pgVar2->m[0xd].n == '\0');
  auVar16[0xe] = -(pgVar2->m[0xe].n == '\0');
  auVar16[0xf] = -(pgVar2->m[0xf].n == '\0');
  uVar14 = (uint)(ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe);
  if (uVar14 == 0) {
    uVar9 = arrays_->groups_size_mask;
    lVar15 = 1;
    do {
      pgVar5[pos0].m[0xf].n = pgVar5[pos0].m[0xf].n | '\x01' << ((byte)hash & 7);
      pos0 = pos0 + lVar15 & uVar9;
      lVar13 = pos0 * 0x10;
      pgVar2 = pgVar5 + pos0;
      auVar17[0] = -(pgVar2->m[0].n == '\0');
      auVar17[1] = -(pgVar2->m[1].n == '\0');
      auVar17[2] = -(pgVar2->m[2].n == '\0');
      auVar17[3] = -(pgVar2->m[3].n == '\0');
      auVar17[4] = -(pgVar2->m[4].n == '\0');
      auVar17[5] = -(pgVar2->m[5].n == '\0');
      auVar17[6] = -(pgVar2->m[6].n == '\0');
      auVar17[7] = -(pgVar2->m[7].n == '\0');
      auVar17[8] = -(pgVar2->m[8].n == '\0');
      auVar17[9] = -(pgVar2->m[9].n == '\0');
      auVar17[10] = -(pgVar2->m[10].n == '\0');
      auVar17[0xb] = -(pgVar2->m[0xb].n == '\0');
      auVar17[0xc] = -(pgVar2->m[0xc].n == '\0');
      auVar17[0xd] = -(pgVar2->m[0xd].n == '\0');
      auVar17[0xe] = -(pgVar2->m[0xe].n == '\0');
      auVar17[0xf] = -(pgVar2->m[0xf].n == '\0');
      uVar11 = (ushort)(SUB161(auVar17 >> 7,0) & 1) | (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe;
      uVar14 = (uint)uVar11;
      lVar15 = lVar15 + 1;
    } while (uVar11 == 0);
  }
  ppVar6 = arrays_->elements_;
  uVar10 = 0;
  if (uVar14 != 0) {
    for (; (uVar14 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
    }
  }
  ppVar3 = ppVar6 + pos0 * 0xf + (ulong)uVar10;
  ppVar3->first = *args->first;
  pbVar7 = args->second;
  paVar4 = &ppVar6[pos0 * 0xf + (ulong)uVar10].second.field_2;
  (&paVar4->_M_allocated_capacity)[-2] = (size_type)paVar4;
  pcVar8 = (pbVar7->_M_dataplus)._M_p;
  paVar1 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar8 == paVar1) {
    sVar12 = *(size_type *)((long)&pbVar7->field_2 + 8);
    paVar4->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    (&paVar4->_M_allocated_capacity)[1] = sVar12;
  }
  else {
    (ppVar3->second)._M_dataplus._M_p = pcVar8;
    (ppVar3->second).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (ppVar3->second)._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  (pgVar5->m + lVar13)[uVar10].n =
       *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                   ::word + (hash & 0xff));
  __return_storage_ptr__->pg =
       (group15<boost::unordered::detail::foa::plain_integral> *)(pgVar5->m + lVar13);
  __return_storage_ptr__->n = uVar10;
  __return_storage_ptr__->p = ppVar3;
  return __return_storage_ptr__;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }